

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

void Gia_AigerWriteUnsignedFile(FILE *pFile,uint x)

{
  for (; 0x7f < x; x = x >> 7) {
    fputc(x & 0xff | 0x80,(FILE *)pFile);
  }
  fputc(x,(FILE *)pFile);
  return;
}

Assistant:

static inline void Gia_AigerWriteUnsignedFile( FILE * pFile, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
        fputc( ch, pFile );
        x >>= 7;
    }
    ch = x;
    fputc( ch, pFile );
}